

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O3

ssize_t __thiscall bitio::stream::read(stream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  byte bVar5;
  uint64_t uVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar10;
  bool bVar11;
  byte bVar9;
  
  if (__fd == 0) {
    return 0;
  }
  bVar9 = (byte)__fd;
  bVar8 = bVar9 & 7;
  if (this->_bit_head == '\b') {
    this->_bit_head = '\0';
    uVar6 = this->_byte_head + 1;
  }
  else {
    uVar6 = this->_byte_head;
  }
  bVar7 = bVar9 >> 3;
  bVar1 = read_byte(this,uVar6,true);
  bVar2 = 8 - this->_bit_head;
  bVar5 = bVar8 - bVar2;
  if (bVar8 < bVar2 || bVar5 == 0) {
    bVar3 = bVar2 - bVar8;
    uVar10 = (ulong)(byte)((u8_rmasks[bVar2] & bVar1) >> (bVar3 & 0x1f));
    uVar4 = this->_bit_head + bVar8;
    this->_bit_head = uVar4;
    if ((7 < bVar9) && (bVar3 != 0)) {
      bVar7 = bVar7 - 1;
      bVar5 = 8 - bVar3;
      uVar10 = (uVar10 << (bVar3 & 0x3f)) + (ulong)(bVar1 & u8_rmasks[bVar3]);
      goto LAB_0010267c;
    }
    if (bVar9 < 8) {
      return uVar10;
    }
    bVar5 = 0;
  }
  else {
    uVar10 = (ulong)(u8_rmasks[bVar2] & bVar1);
LAB_0010267c:
    this->_bit_head = '\b';
    uVar4 = '\b';
    if (bVar7 == 0) goto LAB_001026d5;
  }
  bVar11 = uVar4 == '\b';
  do {
    if (bVar11) {
      this->_bit_head = '\0';
      uVar6 = this->_byte_head + 1;
    }
    else {
      uVar6 = this->_byte_head;
    }
    bVar7 = bVar7 - 1;
    bVar8 = read_byte(this,uVar6,true);
    uVar10 = (ulong)bVar8 | uVar10 << 8;
    this->_bit_head = '\b';
    bVar11 = true;
  } while (bVar7 != 0);
LAB_001026d5:
  if (bVar5 != 0) {
    this->_bit_head = '\0';
    bVar8 = read_byte(this,this->_byte_head + 1,true);
    uVar10 = (uVar10 << (bVar5 & 0x3f)) + (ulong)(bVar8 >> (8 - bVar5 & 0x1f));
    this->_bit_head = this->_bit_head + bVar5;
  }
  return uVar10;
}

Assistant:

uint64_t bitio::stream::read(uint8_t n) {
    if (n == 0) {
        return 0;
    }

    uint64_t value = 0;
    uint8_t nbytes = n >> 3;
    uint8_t nbits = n & 0x7;

    // First, read the leftover bits.
    uint8_t curr_byte = read_next_byte();

    uint8_t rbits = 8 - _bit_head;

    if (nbits <= rbits) {
        value = (curr_byte & u8_rmasks[rbits]) >> (rbits - nbits);
        _bit_head += nbits;
        rbits -= nbits;
        nbits = 0;
    } else {
        value = curr_byte & u8_rmasks[rbits];
        nbits -= rbits;
        rbits = 0;
        _bit_head = 8;
    }

    // Now, if we need to read some nbytes and we have leftover rbits, we borrow a byte from the stream and
    // add the carry to nbits.

    if (rbits != 0) {
        if (nbytes != 0) {
            nbytes--;
            nbits = 8 - rbits;
            value <<= rbits;
            value += curr_byte & u8_rmasks[rbits];
            _bit_head = 8;
        }
    }

    // Now, read the nbytes.
    while (nbytes--) {
        value <<= 0x8;
        value += read_next_byte();
        _bit_head = 8;
    }

    // Read the remaining nbits. We don't need masks here because, bit_head is always 8 if nbits != 0
    if (nbits != 0) {
        curr_byte = read_next_byte();
        value <<= nbits;
        value += (curr_byte >> (8 - nbits));
        _bit_head += nbits;
    }

    return value;
}